

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

void __thiscall bssl::TemporaryFile::~TemporaryFile(TemporaryFile *this)

{
  char *__name;
  uint uVar1;
  int iVar2;
  TemporaryFile *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __name = (char *)std::__cxx11::string::c_str();
    iVar2 = unlink(__name);
    if (iVar2 != 0) {
      perror("Could not delete file");
    }
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TemporaryFile::~TemporaryFile() {
#if defined(OPENSSL_WINDOWS)
  if (!path_.empty() && !DeleteFileA(path_.c_str())) {
    PrintLastError("Could not delete file");
  }
#else
  if (!path_.empty() && unlink(path_.c_str()) != 0) {
    perror("Could not delete file");
  }
#endif
}